

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenuadaptor.cpp
# Opt level: O2

QString * __thiscall
QDBusMenuAdaptor::status(QString *__return_storage_ptr__,QDBusMenuAdaptor *this)

{
  QLoggingCategory *pQVar1;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QDebug local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QtPrivateLogging::qLcMenu();
  if (((pQVar1->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    QMessageLogger::debug();
    QDebug::~QDebug(&local_20);
  }
  latin1.m_data = "normal";
  latin1.m_size = 6;
  QString::QString(__return_storage_ptr__,latin1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QDBusMenuAdaptor::status() const
{
    qCDebug(qLcMenu);
    return "normal"_L1;
}